

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O2

float __thiscall benchmark_6::run_kernel(benchmark_6 *this,size_t iterations)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 in_register_00000004;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar15 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar16 [64];
  undefined1 in_XMM7 [16];
  undefined1 auVar12 [64];
  
  uVar3 = rdtsc();
  auVar5 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  uVar3 = rdtsc();
  rdtsc();
  uVar4 = rdtsc();
  auVar11 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,
                               uVar3 & 0xffffffff00000000 |
                               CONCAT44(in_register_00000004,(int)uVar3));
  uVar9 = auVar11._0_4_;
  auVar14 = ZEXT3264(CONCAT428(uVar9,CONCAT424(uVar9,CONCAT420(uVar9,CONCAT416(uVar9,CONCAT412(uVar9
                                                  ,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))))))));
  auVar11 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,
                               uVar4 & 0xffffffff00000000 |
                               CONCAT44(in_register_00000004,(int)uVar4));
  uVar3 = rdtsc();
  uVar9 = auVar5._0_4_;
  auVar12 = ZEXT3264(CONCAT428(uVar9,CONCAT424(uVar9,CONCAT420(uVar9,CONCAT416(uVar9,CONCAT412(uVar9
                                                  ,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))))))));
  uVar9 = auVar11._0_4_;
  auVar13 = ZEXT3264(CONCAT428(uVar9,CONCAT424(uVar9,CONCAT420(uVar9,CONCAT416(uVar9,CONCAT412(uVar9
                                                  ,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))))))));
  auVar5 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  uVar3 = rdtsc();
  auVar1 = *(undefined1 (*) [32])(this->super_benchmark).mul0;
  auVar2 = *(undefined1 (*) [32])(this->super_benchmark).mul1;
  uVar9 = auVar5._0_4_;
  auVar15 = ZEXT3264(CONCAT428(uVar9,CONCAT424(uVar9,CONCAT420(uVar9,CONCAT416(uVar9,CONCAT412(uVar9
                                                  ,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))))))));
  auVar5 = vcvtusi2ss_avx512f(in_XMM7,uVar3 & 0xffffffff00000000 |
                                      CONCAT44(in_register_00000004,(int)uVar3));
  uVar9 = auVar5._0_4_;
  auVar16 = ZEXT3264(CONCAT428(uVar9,CONCAT424(uVar9,CONCAT420(uVar9,CONCAT416(uVar9,CONCAT412(uVar9
                                                  ,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))))))));
  do {
    auVar5 = vfmadd231ps_fma(auVar12._0_32_,auVar1,auVar2);
    auVar12 = ZEXT1664(auVar5);
    auVar11 = vfmadd231ps_fma(auVar14._0_32_,auVar1,auVar2);
    auVar14 = ZEXT1664(auVar11);
    auVar6 = vfmadd231ps_fma(auVar13._0_32_,auVar1,auVar2);
    auVar13 = ZEXT1664(auVar6);
    auVar7 = vfmadd231ps_fma(auVar15._0_32_,auVar1,auVar2);
    auVar15 = ZEXT1664(auVar7);
    auVar8 = vfmadd231ps_fma(auVar16._0_32_,auVar1,auVar2);
    auVar16 = ZEXT1664(auVar8);
    iterations = iterations - 1;
  } while (iterations != 0);
  auVar10._0_4_ =
       auVar6._0_4_ + auVar8._0_4_ + auVar5._0_4_ + auVar6._0_4_ + auVar11._0_4_ + auVar7._0_4_ +
       0.0;
  auVar10._4_4_ =
       auVar6._4_4_ + auVar8._4_4_ + auVar5._4_4_ + auVar6._4_4_ + auVar11._4_4_ + auVar7._4_4_ +
       0.0;
  auVar10._8_4_ =
       auVar6._8_4_ + auVar8._8_4_ + auVar5._8_4_ + auVar6._8_4_ + auVar11._8_4_ + auVar7._8_4_ +
       0.0;
  auVar10._12_4_ =
       auVar6._12_4_ + auVar8._12_4_ +
       auVar5._12_4_ + auVar6._12_4_ + auVar11._12_4_ + auVar7._12_4_ + 0.0;
  auVar5 = vshufpd_avx(auVar10,auVar10,1);
  auVar11._0_4_ = auVar10._0_4_ + auVar5._0_4_;
  auVar11._4_4_ = auVar10._4_4_ + auVar5._4_4_;
  auVar11._8_4_ = auVar10._8_4_ + auVar5._8_4_;
  auVar11._12_4_ = auVar10._12_4_ + auVar5._12_4_;
  auVar5 = vhaddps_avx(auVar11,auVar11);
  return auVar5._0_4_;
}

Assistant:

float run_kernel(size_t iterations) const override
    {
            __m256 r0 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r1 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r2 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r3 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r4 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r5 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            do{
                r0 = _mm256_fmadd_ps(mul0, mul1, r0);
                r1 = _mm256_fmadd_ps(mul0, mul1, r1);
                r2 = _mm256_fmadd_ps(mul0, mul1, r2);
                r3 = _mm256_fmadd_ps(mul0, mul1, r3);
                r4 = _mm256_fmadd_ps(mul0, mul1, r4);
                r5 = _mm256_fmadd_ps(mul0, mul1, r5);

            }while (--iterations);

            r0 = _mm256_add_ps(r0, r3);
            r1 = _mm256_add_ps(r1, r4);
            r2 = _mm256_add_ps(r3, r5);

            r0 = _mm256_add_ps(r0, r1);
            r0 = _mm256_add_ps(r0, r2);

            return __m256_reduce_add_ps(r0);
    }